

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O2

void __thiscall
duckdb::SQLLogicTestLogger::ExpectedErrorMismatch
          (SQLLogicTestLogger *this,string *expected_error,MaterializedQueryResult *result)

{
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"Query failed, but error message did not match expected error message: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expected_error
                );
  PrintErrorHeader(this,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  PrintLineSep();
  PrintSQL(this);
  std::__cxx11::string::string((string *)&sStack_58,"Actual result:",(allocator *)&local_38);
  PrintHeader(&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  PrintLineSep();
  duckdb::QueryResult::Print();
  return;
}

Assistant:

void SQLLogicTestLogger::ExpectedErrorMismatch(const string &expected_error, MaterializedQueryResult &result) {
	PrintErrorHeader("Query failed, but error message did not match expected error message: " + expected_error);
	PrintLineSep();
	PrintSQL();
	PrintHeader("Actual result:");
	PrintLineSep();
	result.Print();
}